

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxIn>::Deserialize
          (JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxIn> *this,string *value)

{
  size_t in_RCX;
  void *__buf;
  int in_ESI;
  long *in_RDI;
  UniValue object;
  UniValue *this_00;
  UniValue local_68;
  int local_10;
  
  this_00 = &local_68;
  local_10 = in_ESI;
  UniValue::UniValue(this_00);
  UniValue::read(this_00,local_10,__buf,in_RCX);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_68);
  UniValue::~UniValue(this_00);
  return;
}

Assistant:

virtual void Deserialize(const std::string& value) {
    UniValue object;
    object.read(value);
    DeserializeUniValue(object);
  }